

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O0

int Gia_ManConeMark(Gia_Man_t *p,int iOut,int Limit)

{
  int iVar1;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj_00;
  bool bVar2;
  undefined4 local_2c;
  int RetValue;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vRoots;
  int Limit_local;
  int iOut_local;
  Gia_Man_t *p_local;
  
  _RetValue = Gia_ManPo(p,iOut);
  p_00 = Vec_IntAlloc(100);
  iVar1 = Gia_ObjId(p,_RetValue);
  Vec_IntPush(p_00,iVar1);
  Gia_ManIncrementTravId(p);
  pObj_00 = Gia_ManConst0(p);
  Gia_ObjSetTravIdCurrent(p,pObj_00);
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p_00);
    bVar2 = false;
    if (local_2c < iVar1) {
      iVar1 = Vec_IntEntry(p_00,local_2c);
      _RetValue = Gia_ManObj(p,iVar1);
      bVar2 = _RetValue != (Gia_Obj_t *)0x0;
    }
    if ((!bVar2) || (iVar1 = Gia_ManConeMark_rec(p,_RetValue,p_00,Limit), iVar1 != 0)) break;
    local_2c = local_2c + 1;
  }
  iVar1 = Vec_IntSize(p_00);
  Vec_IntFree(p_00);
  return iVar1 + -1;
}

Assistant:

int Gia_ManConeMark( Gia_Man_t * p, int iOut, int Limit )
{
    Vec_Int_t * vRoots;
    Gia_Obj_t * pObj;
    int i, RetValue;
    // start the outputs
    pObj = Gia_ManPo( p, iOut );
    vRoots = Vec_IntAlloc( 100 );
    Vec_IntPush( vRoots, Gia_ObjId(p, pObj) );
    // mark internal nodes
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Gia_ManForEachObjVec( vRoots, p, pObj, i )
        if ( Gia_ManConeMark_rec( p, pObj, vRoots, Limit ) )
            break;
    RetValue = Vec_IntSize( vRoots ) - 1;
    Vec_IntFree( vRoots );
    return RetValue;
}